

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O3

int main(void)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char s [10];
  undefined8 local_30;
  undefined2 local_28;
  
  local_30 = 0x7878787878007878;
  local_28 = 0x78;
  sVar4 = strlen((char *)&local_30);
  *(undefined4 *)((long)&local_30 + sVar4) = 0x64636261;
  *(undefined2 *)((long)&local_30 + sVar4 + 4) = 0x65;
  if (local_30._2_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2b,"s[2] == \'a\'");
  }
  if (local_30._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2c,"s[6] == \'e\'");
  }
  if (local_30._7_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2d,"s[7] == \'\\0\'");
  }
  if ((char)local_28 != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2e,"s[8] == \'x\'");
  }
  local_30 = local_30 & 0xffffffffffffff00;
  sVar4 = strlen((char *)&local_30);
  *(undefined4 *)((long)&local_30 + sVar4) = 0x64636261;
  *(undefined2 *)((long)&local_30 + sVar4 + 4) = 0x78;
  if (local_30._4_1_ != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x31,"s[4] == \'x\'");
  }
  cVar1 = local_30._5_1_;
  if (local_30._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x32,"s[5] == \'\\0\'");
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x34,"s[5] == \'\\0\'");
  }
  cVar2 = local_30._6_1_;
  if (local_30._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x35,"s[6] == \'e\'");
  }
  if (cVar1 != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x37,"s[5] == \'\\0\'");
  }
  pcVar3 = (char *)&local_30;
  if (cVar2 != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x38,"s[6] == \'e\'");
  }
  do {
    pcVar5 = pcVar3;
    pcVar3 = pcVar5 + 1;
  } while (*pcVar5 != '\0');
  builtin_strncpy(pcVar5,"abc",4);
  if (local_30._5_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3a,"s[5] == \'a\'");
  }
  if (local_30._7_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3b,"s[7] == \'c\'");
  }
  if ((char)local_28 != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3c,"s[8] == \'\\0\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xx\0xxxxxx";
    TESTCASE( strncat( s, abcde, 10 ) == s );
    TESTCASE( s[2] == 'a' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( s[7] == '\0' );
    TESTCASE( s[8] == 'x' );
    s[0] = '\0';
    TESTCASE( strncat( s, abcdx, 10 ) == s );
    TESTCASE( s[4] == 'x' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strncat( s, "\0", 10 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 0 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 3 ) == s );
    TESTCASE( s[5] == 'a' );
    TESTCASE( s[7] == 'c' );
    TESTCASE( s[8] == '\0' );
    return TEST_RESULTS;
}